

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_loop(JSContext *ctx)

{
  int iVar1;
  JSContext *in_RDI;
  int err;
  JSContext *unaff_retaddr;
  JSContext *ctx1;
  JSContext **in_stack_00000020;
  JSRuntime *in_stack_00000028;
  
  do {
    do {
      JS_GetRuntime(in_RDI);
      iVar1 = JS_ExecutePendingJob(in_stack_00000028,in_stack_00000020);
    } while (0 < iVar1);
    if (iVar1 < 0) {
      js_std_dump_error(unaff_retaddr);
    }
  } while ((os_poll_func != (_func_int_JSContext_ptr *)0x0) &&
          (iVar1 = (*os_poll_func)(in_RDI), iVar1 == 0));
  return;
}

Assistant:

void js_std_loop(JSContext *ctx)
{
    JSContext *ctx1;
    int err;

    for(;;) {
        /* execute the pending jobs */
        for(;;) {
            err = JS_ExecutePendingJob(JS_GetRuntime(ctx), &ctx1);
            if (err <= 0) {
                if (err < 0) {
                    js_std_dump_error(ctx1);
                }
                break;
            }
        }

        if (!os_poll_func || os_poll_func(ctx))
            break;
    }
}